

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

int mspace_track_large_chunks(mspace msp,int enable)

{
  mstate ms;
  int ret;
  int enable_local;
  mspace msp_local;
  
  ms._0_4_ = (uint)((*(uint *)((long)msp + 0x370) & 1) == 0);
  if (enable == 0) {
    *(uint *)((long)msp + 0x370) = *(uint *)((long)msp + 0x370) | 1;
  }
  else {
    *(uint *)((long)msp + 0x370) = *(uint *)((long)msp + 0x370) & 0xfffffffe;
  }
  return (uint)ms;
}

Assistant:

int mspace_track_large_chunks(mspace msp, int enable) {
  int ret = 0;
  mstate ms = (mstate)msp;
  if (!PREACTION(ms)) {
    if (!use_mmap(ms)) {
      ret = 1;
    }
    if (!enable) {
      enable_mmap(ms);
    } else {
      disable_mmap(ms);
    }
    POSTACTION(ms);
  }
  return ret;
}